

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CFrame::ExternalCall
          (CFrame *this,string *functionName,
          unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
          *args)

{
  CCallExpression *this_00;
  CNameExpression *this_01;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> *in_RCX;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_a0;
  undefined1 local_91;
  string local_90 [32];
  CLabel local_70;
  unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_> local_40;
  unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_> local_38;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_30 [2];
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  *args_local;
  string *functionName_local;
  CFrame *this_local;
  
  args_local = args;
  functionName_local = functionName;
  this_local = this;
  this_00 = (CCallExpression *)operator_new(0x18);
  this_01 = (CNameExpression *)operator_new(0x28);
  local_91 = 1;
  std::__cxx11::string::string(local_90,(string *)args_local);
  CLabel::CLabel(&local_70,(string *)local_90);
  CNameExpression::CNameExpression(this_01,&local_70);
  local_91 = 0;
  std::unique_ptr<IRT::CNameExpression_const,std::default_delete<IRT::CNameExpression_const>>::
  unique_ptr<std::default_delete<IRT::CNameExpression_const>,void>
            ((unique_ptr<IRT::CNameExpression_const,std::default_delete<IRT::CNameExpression_const>>
              *)&local_40,this_01);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  unique_ptr(&local_38,&local_40);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  unique_ptr(&local_a0,in_RCX);
  CCallExpression::CCallExpression(this_00,&local_38,&local_a0);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             local_30,(pointer)this_00);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             this,local_30);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (local_30);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr(&local_a0);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  ~unique_ptr(&local_38);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  ~unique_ptr(&local_40);
  CLabel::~CLabel(&local_70);
  std::__cxx11::string::~string(local_90);
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CExpression>
CFrame::ExternalCall(const std::string &functionName, std::unique_ptr<const CExpressionList> args) const {
    return std::move(std::unique_ptr<const CExpression>(
            new CCallExpression(
                    std::move(std::unique_ptr<const CNameExpression>(
                            new CNameExpression(CLabel(functionName))
                    )),
                    std::move(args)
            )
    ));
}